

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall
wallet::anon_unknown_5::WalletImpl::tryGetBalances
          (WalletImpl *this,WalletBalances *balances,uint256 *block_hash)

{
  bool bVar1;
  AnnotatedMixin<std::recursive_mutex> *in_RDX;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> locked_wallet;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 in_stack_ffffffffffffff5b;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined1 local_70 [72];
  int local_28;
  uint uStack_24;
  int iStack_20;
  uint uStack_1c;
  int local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffff38);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RSI,in_RDX,(char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b);
  bVar1 = UniqueLock::operator_cast_to_bool
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff38)
  ;
  if (bVar1) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (in_stack_ffffffffffffff38);
    CWallet::GetLastBlockHash
              ((CWallet *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    (in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__data.__kind = local_18;
    *(undefined4 *)
     ((long)&(in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex + 0x14) =
         uStack_14;
    *(undefined4 *)
     ((long)&(in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex + 0x18) =
         uStack_10;
    *(undefined4 *)
     ((long)&(in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex + 0x1c) =
         uStack_c;
    (in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__data.__lock = local_28;
    (in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__data.__count = uStack_24
    ;
    (in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__data.__owner = iStack_20
    ;
    (in_RDX->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__data.__nusers =
         uStack_1c;
    (**(code **)(*in_RDI + 0x148))(local_70);
    memcpy(in_RSI,local_70,0x38);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool tryGetBalances(WalletBalances& balances, uint256& block_hash) override
    {
        TRY_LOCK(m_wallet->cs_wallet, locked_wallet);
        if (!locked_wallet) {
            return false;
        }
        block_hash = m_wallet->GetLastBlockHash();
        balances = getBalances();
        return true;
    }